

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteSFixed32
               (int field_number,int32_t value,CodedOutputStream *output)

{
  WriteTag(field_number,WIRETYPE_FIXED32,output);
  io::CodedOutputStream::WriteLittleEndian32(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed32(int field_number, int32_t value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteSFixed32NoTag(value, output);
}